

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

RPCHelpMan * getaddrmaninfo(void)

{
  initializer_list<RPCResult> __l;
  initializer_list<RPCResult> __l_00;
  RPCHelpMan *in_RDI;
  long in_FS_OFFSET;
  allocator<RPCResult> *in_stack_fffffffffffff7b8;
  RPCResult *this;
  anon_class_1_0_00000001 *in_stack_fffffffffffff7c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7d0;
  undefined1 in_stack_fffffffffffff7e7;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff7f0;
  allocator<char> *in_stack_fffffffffffff7f8;
  iterator in_stack_fffffffffffff800;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff808;
  undefined1 in_stack_fffffffffffff81f;
  vector<RPCResult,_std::allocator<RPCResult>_> *in_stack_fffffffffffff820;
  RPCHelpMan *pRVar1;
  string *in_stack_fffffffffffff828;
  RPCHelpMan *pRVar2;
  RPCResult *in_stack_fffffffffffff830;
  RPCResults *in_stack_fffffffffffff838;
  RPCResult *in_stack_fffffffffffff840;
  pointer *ppRVar3;
  undefined1 *local_7b8;
  RPCHelpMan *results;
  vector<RPCArg,_std::allocator<RPCArg>_> *args;
  undefined6 in_stack_fffffffffffff918;
  undefined1 uVar4;
  undefined1 uVar5;
  string *name;
  undefined1 local_690 [35];
  allocator<char> local_66d;
  allocator<char> local_66c;
  allocator<char> local_66b [3];
  pointer local_668;
  pointer pRStack_660;
  pointer local_658;
  allocator<char> local_64a;
  allocator<char> local_649;
  _Alloc_hider local_648;
  size_type sStack_640;
  undefined1 local_638 [15];
  allocator<char> local_629;
  _Alloc_hider local_628;
  size_type sStack_620;
  undefined1 local_618 [15];
  allocator<char> local_609 [41];
  RPCMethodImpl *in_stack_fffffffffffffa20;
  allocator<char> local_5d1 [31];
  allocator<char> local_5b2;
  allocator<char> local_5b1 [25];
  undefined8 local_598;
  undefined8 uStack_590;
  undefined8 local_588;
  allocator<char> local_572;
  vector<RPCArg,_std::allocator<RPCArg>_> local_571 [18];
  RPCHelpMan local_3b0;
  string local_2a0 [4];
  RPCHelpMan local_218;
  undefined1 local_110 [264];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  args = local_571;
  results = in_RDI;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_598 = 0;
  uStack_590 = 0;
  local_588 = 0;
  std::vector<RPCArg,_std::allocator<RPCArg>_>::vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7b8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  GetNetworkNames_abi_cxx11_((bool)in_stack_fffffffffffff7e7);
  util::Join<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>,char[3]>
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)in_stack_fffffffffffff7d0,(char (*) [3])in_stack_fffffffffffff7c8);
  std::operator+((char *)in_stack_fffffffffffff7d0,in_stack_fffffffffffff7c8);
  std::operator+(in_stack_fffffffffffff7d0,(char *)in_stack_fffffffffffff7c8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_628._M_p = (pointer)0x0;
  sStack_620 = 0;
  local_618._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,(Type)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (string *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820
             ,(bool)in_stack_fffffffffffff81f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_648._M_p = (pointer)0x0;
  sStack_640 = 0;
  local_638._0_8_ = 0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,(Type)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (string *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820
             ,(bool)in_stack_fffffffffffff81f);
  name = local_2a0;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  local_668 = (pointer)0x0;
  pRStack_660 = (pointer)0x0;
  local_658 = (pointer)0x0;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7b8);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,(Type)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (string *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820
             ,(bool)in_stack_fffffffffffff81f);
  uVar5 = 0;
  pRVar2 = &local_3b0;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff7b8);
  __l._M_len = (size_type)in_stack_fffffffffffff808;
  __l._M_array = in_stack_fffffffffffff800;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7f8,__l,
             (allocator_type *)in_stack_fffffffffffff7f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,(Type)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (string *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820
             ,(bool)in_stack_fffffffffffff81f);
  uVar4 = 0;
  std::allocator<RPCResult>::allocator(in_stack_fffffffffffff7b8);
  __l_00._M_len = (size_type)in_stack_fffffffffffff808;
  __l_00._M_array = in_stack_fffffffffffff800;
  std::vector<RPCResult,_std::allocator<RPCResult>_>::vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7f8,__l_00,
             (allocator_type *)in_stack_fffffffffffff7f0);
  RPCResult::RPCResult
            (in_stack_fffffffffffff840,(Type)((ulong)in_stack_fffffffffffff838 >> 0x20),
             (string *)in_stack_fffffffffffff830,in_stack_fffffffffffff828,in_stack_fffffffffffff820
             ,(bool)in_stack_fffffffffffff81f);
  RPCResults::RPCResults(in_stack_fffffffffffff838,in_stack_fffffffffffff830);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  HelpExampleCli(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffff808,(char *)in_stack_fffffffffffff800,in_stack_fffffffffffff7f8);
  HelpExampleRpc(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  std::operator+(in_stack_fffffffffffff7f0,in_stack_fffffffffffff7e8);
  RPCExamples::RPCExamples((RPCExamples *)in_stack_fffffffffffff7b8,(string *)0x651db9);
  this = (RPCResult *)local_690;
  std::function<UniValue(RPCHelpMan_const&,JSONRPCRequest_const&)>::
  function<getaddrmaninfo()::__0,void>
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)
             in_stack_fffffffffffff7c8,in_stack_fffffffffffff7c0);
  RPCHelpMan::RPCHelpMan
            (pRVar2,name,(string *)CONCAT17(uVar5,CONCAT16(uVar4,in_stack_fffffffffffff918)),args,
             (RPCResults *)results,(RPCExamples *)in_RDI,in_stack_fffffffffffffa20);
  std::function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)>::~function
            ((function<UniValue_(const_RPCHelpMan_&,_const_JSONRPCRequest_&)> *)this);
  RPCExamples::~RPCExamples((RPCExamples *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_690 + 0x22));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_66d);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_66c);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_66b);
  RPCResults::~RPCResults((RPCResults *)this);
  RPCResult::~RPCResult(this);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  ppRVar3 = (pointer *)
            ((long)&local_218.m_results.m_results.
                    super__Vector_base<RPCResult,_std::allocator<RPCResult>_>._M_impl + 8);
  local_7b8 = local_110;
  do {
    local_7b8 = local_7b8 + -0x88;
    RPCResult::~RPCResult(this);
  } while ((pointer *)local_7b8 != ppRVar3);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::allocator<RPCResult>::~allocator((allocator<RPCResult> *)this);
  pRVar2 = &local_3b0;
  pRVar1 = &local_218;
  do {
    pRVar1 = (RPCHelpMan *)&pRVar1[-1].m_fun.super__Function_base._M_manager;
    RPCResult::~RPCResult(this);
  } while (pRVar1 != pRVar2);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_64a);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_649);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_638 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_629);
  std::vector<RPCResult,_std::allocator<RPCResult>_>::~vector
            ((vector<RPCResult,_std::allocator<RPCResult>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)(local_618 + 0xe));
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_609);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_5d1);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_5b2);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(local_5b1);
  std::vector<RPCArg,_std::allocator<RPCArg>_>::~vector
            ((vector<RPCArg,_std::allocator<RPCArg>_> *)in_stack_fffffffffffff7c8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator(&local_572);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this);
  std::allocator<char>::~allocator((allocator<char> *)local_571);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return results;
  }
  __stack_chk_fail();
}

Assistant:

static RPCHelpMan getaddrmaninfo()
{
    return RPCHelpMan{
        "getaddrmaninfo",
        "\nProvides information about the node's address manager by returning the number of "
        "addresses in the `new` and `tried` tables and their sum for all networks.\n",
        {},
        RPCResult{
            RPCResult::Type::OBJ_DYN, "", "json object with network type as keys", {
                {RPCResult::Type::OBJ, "network", "the network (" + Join(GetNetworkNames(), ", ") + ", all_networks)", {
                {RPCResult::Type::NUM, "new", "number of addresses in the new table, which represent potential peers the node has discovered but hasn't yet successfully connected to."},
                {RPCResult::Type::NUM, "tried", "number of addresses in the tried table, which represent peers the node has successfully connected to in the past."},
                {RPCResult::Type::NUM, "total", "total number of addresses in both new/tried tables"},
            }},
        }},
        RPCExamples{HelpExampleCli("getaddrmaninfo", "") + HelpExampleRpc("getaddrmaninfo", "")},
        [&](const RPCHelpMan& self, const JSONRPCRequest& request) -> UniValue {
            AddrMan& addrman = EnsureAnyAddrman(request.context);

            UniValue ret(UniValue::VOBJ);
            for (int n = 0; n < NET_MAX; ++n) {
                enum Network network = static_cast<enum Network>(n);
                if (network == NET_UNROUTABLE || network == NET_INTERNAL) continue;
                UniValue obj(UniValue::VOBJ);
                obj.pushKV("new", addrman.Size(network, true));
                obj.pushKV("tried", addrman.Size(network, false));
                obj.pushKV("total", addrman.Size(network));
                ret.pushKV(GetNetworkName(network), std::move(obj));
            }
            UniValue obj(UniValue::VOBJ);
            obj.pushKV("new", addrman.Size(std::nullopt, true));
            obj.pushKV("tried", addrman.Size(std::nullopt, false));
            obj.pushKV("total", addrman.Size());
            ret.pushKV("all_networks", std::move(obj));
            return ret;
        },
    };
}